

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void sub_one_frombill(obj *obj,monst *shkp)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  short sVar6;
  bill_x *pbVar7;
  obj *obj_00;
  long lVar8;
  int iVar9;
  obj *poVar10;
  byte bVar11;
  
  bVar11 = 0;
  pbVar7 = onbill(obj,shkp,'\0');
  if (pbVar7 == (bill_x *)0x0) {
    if ((*(uint *)&obj->field_0x4a & 4) != 0) {
      warning("sub_one_frombill: unpaid object not on bill");
      obj->field_0x4a = obj->field_0x4a & 0xfb;
    }
  }
  else {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffffb;
    iVar9 = obj->quan;
    if (iVar9 < pbVar7->bquan) {
      obj_00 = (obj *)malloc(0x68);
      poVar10 = obj_00;
      for (lVar8 = 0xd; uVar4 = flags.ident, lVar8 != 0; lVar8 = lVar8 + -1) {
        poVar10->nobj = obj->nobj;
        obj = (obj *)((long)obj + (ulong)bVar11 * -0x10 + 8);
        poVar10 = (obj *)((long)poVar10 + (ulong)bVar11 * -0x10 + 8);
      }
      uVar5 = flags.ident + 1;
      obj_00->o_id = flags.ident;
      flags.ident = uVar5;
      pbVar7->bo_id = uVar4;
      obj_00->where = '\0';
      iVar9 = pbVar7->bquan - iVar9;
      pbVar7->bquan = iVar9;
      obj_00->quan = iVar9;
      obj_00->owt = 0;
      obj_00->onamelth = '\0';
      obj_00->oxlth = 0;
      obj_00->field_0x4c = obj_00->field_0x4c & 0x9f;
      pbVar7->useup = '\x01';
      add_to_billobjs(obj_00);
      return;
    }
    sVar6 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2) + -1;
    *(short *)((long)&shkp[0x1b].misc_worn_check + 2) = sVar6;
    puVar1 = (undefined8 *)(*(long *)&shkp[0x1b].mnum + (long)sVar6 * 0x10);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    pbVar7->bo_id = (int)uVar2;
    pbVar7->useup = (char)((ulong)uVar2 >> 0x20);
    *(int3 *)&pbVar7->field_0x5 = (int3)((ulong)uVar2 >> 0x28);
    pbVar7->price = (int)uVar3;
    pbVar7->bquan = (int)((ulong)uVar3 >> 0x20);
  }
  return;
}

Assistant:

static void sub_one_frombill(struct obj *obj, struct monst *shkp)
{
	struct bill_x *bp;

	if ((bp = onbill(obj, shkp, FALSE)) != 0) {
		struct obj *otmp;

		obj->unpaid = 0;
		if (bp->bquan > obj->quan){
			otmp = newobj(0);
			*otmp = *obj;
			bp->bo_id = otmp->o_id = flags.ident++;
			otmp->where = OBJ_FREE;
			otmp->quan = (bp->bquan -= obj->quan);
			otmp->owt = 0;	/* superfluous */
			otmp->onamelth = 0;
			otmp->oxlth = 0;
			otmp->oattached = OATTACHED_NOTHING;
			bp->useup = 1;
			add_to_billobjs(otmp);
			return;
		}
		ESHK(shkp)->billct--;
		*bp = ESHK(shkp)->bill_p[ESHK(shkp)->billct];
		
		return;
	} else if (obj->unpaid) {
		warning("sub_one_frombill: unpaid object not on bill");
		obj->unpaid = 0;
	}
}